

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_remove_all(REF_GEOM ref_geom,REF_INT node)

{
  REF_ADJ pRVar1;
  uint uVar2;
  REF_INT local_3c;
  REF_INT local_38;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT geom;
  REF_INT item;
  REF_ADJ ref_adj;
  REF_INT node_local;
  REF_GEOM ref_geom_local;
  
  pRVar1 = ref_geom->ref_adj;
  if ((node < 0) || (pRVar1->nnode <= node)) {
    local_38 = -1;
  }
  else {
    local_38 = pRVar1->first[node];
  }
  ref_private_macro_code_rss = local_38;
  while( true ) {
    if (ref_private_macro_code_rss == -1) {
      return 0;
    }
    uVar2 = ref_geom_remove(ref_geom,pRVar1->item[ref_private_macro_code_rss].ref);
    if (uVar2 != 0) break;
    if ((node < 0) || (pRVar1->nnode <= node)) {
      local_3c = -1;
    }
    else {
      local_3c = pRVar1->first[node];
    }
    ref_private_macro_code_rss = local_3c;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x247,
         "ref_geom_remove_all",(ulong)uVar2,"remove");
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_remove_all(REF_GEOM ref_geom, REF_INT node) {
  REF_ADJ ref_adj = ref_geom_adj(ref_geom);
  REF_INT item, geom;

  item = ref_adj_first(ref_adj, node);
  while (ref_adj_valid(item)) {
    geom = ref_adj_item_ref(ref_adj, item);

    RSS(ref_geom_remove(ref_geom, geom), "remove");

    item = ref_adj_first(ref_adj, node);
  }

  return REF_SUCCESS;
}